

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*>::
emplace_back<slang::syntax::DelayedSequenceElementSyntax*>
          (SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*> *this,
          DelayedSequenceElementSyntax **args)

{
  iterator ppDVar1;
  DelayedSequenceElementSyntax **args_local;
  SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppDVar1 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
    this_local = (SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)
                 emplaceRealloc<slang::syntax::DelayedSequenceElementSyntax*>(this,ppDVar1,args);
  }
  else {
    ppDVar1 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
    *ppDVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)
                 SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::back
                           ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }